

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_>::Data
          (Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_> *this,
          Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  Node<QPlatformTextureList_*,_bool> *pNVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  R RVar16;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar14 = other->numBuckets;
  sVar15 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar15;
  this->spans = (Span *)0x0;
  RVar16 = allocateSpans(sVar14);
  this->spans = (Span *)RVar16.spans;
  if (RVar16.nSpans != 0) {
    lVar13 = 0;
    sVar14 = 0;
    do {
      pSVar2 = other->spans;
      sVar15 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar15 + lVar13];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar14].entries;
          pNVar12 = Span<QHashPrivate::Node<QPlatformTextureList_*,_bool>_>::insert
                              (this->spans + sVar14,sVar15);
          pEVar3 = pEVar3 + bVar1;
          uVar4 = (pEVar3->storage).data[8];
          uVar5 = (pEVar3->storage).data[9];
          uVar6 = (pEVar3->storage).data[10];
          uVar7 = (pEVar3->storage).data[0xb];
          uVar8 = (pEVar3->storage).data[0xc];
          uVar9 = (pEVar3->storage).data[0xd];
          uVar10 = (pEVar3->storage).data[0xe];
          uVar11 = (pEVar3->storage).data[0xf];
          pNVar12->key = *(QPlatformTextureList **)(pEVar3->storage).data;
          pNVar12->value = (bool)uVar4;
          pNVar12->field_0x9 = uVar5;
          pNVar12->field_0xa = uVar6;
          pNVar12->field_0xb = uVar7;
          pNVar12->field_0xc = uVar8;
          pNVar12->field_0xd = uVar9;
          pNVar12->field_0xe = uVar10;
          pNVar12->field_0xf = uVar11;
        }
        sVar15 = sVar15 + 1;
      } while (sVar15 != 0x80);
      sVar14 = sVar14 + 1;
      lVar13 = lVar13 + 0x90;
    } while (sVar14 != RVar16.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }